

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error astcenc_compress_cancel(astcenc_context *ctxo)

{
  long in_RDI;
  astcenc_contexti *ctx;
  undefined4 local_4;
  
  if ((*(uint *)(in_RDI + 4) & 0x10) == 0) {
    ParallelManager::cancel((ParallelManager *)0x5474bc);
    ParallelManager::cancel((ParallelManager *)0x5474cd);
    local_4 = ASTCENC_SUCCESS;
  }
  else {
    local_4 = ASTCENC_ERR_BAD_CONTEXT;
  }
  return local_4;
}

Assistant:

astcenc_error astcenc_compress_cancel(
	astcenc_context* ctxo
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	// Cancel compression before cancelling avg. This avoids the race condition
	// where cancelling them in the other order could see a compression worker
	// starting to process even though some of the avg data is undefined.
	ctxo->manage_compress.cancel();
	ctxo->manage_avg.cancel();
	return ASTCENC_SUCCESS;
#endif
}